

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

int __thiscall diy::FileStorage::put(FileStorage *this,MemoryBuffer *bb)

{
  int iVar1;
  element_type *peVar2;
  MemoryBuffer *this_00;
  reference __buf;
  _Base_ptr in_RSI;
  string *in_RDI;
  r_type written;
  size_t sz;
  int fh;
  string filename;
  shared_ptr<diy::spd::logger> log;
  FileStorage *this_01;
  ssize_t local_70;
  size_t local_68;
  MemoryBuffer *local_60 [3];
  int local_44;
  _Base_ptr local_10;
  
  local_10 = in_RSI;
  get_logger();
  this_01 = (FileStorage *)&stack0xffffffffffffffc0;
  std::__cxx11::string::string((string *)this_01);
  local_44 = open_random(this_01,in_RDI);
  peVar2 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11e60a);
  this_00 = (MemoryBuffer *)MemoryBuffer::size((MemoryBuffer *)0x11e61c);
  local_60[0] = this_00;
  spd::logger::debug<std::__cxx11::string,unsigned_long>
            (peVar2,"FileStorage::put(): {}; buffer size: {}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffc0,(unsigned_long *)local_60);
  local_68 = std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)&local_10->_M_left);
  iVar1 = local_44;
  __buf = std::vector<char,_std::allocator<char>_>::operator[]
                    ((vector<char,_std::allocator<char>_> *)&local_10->_M_left,0);
  local_70 = write(iVar1,__buf,local_68);
  if ((local_70 < (long)local_68) || (local_70 == -1)) {
    peVar2 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11e6c0);
    spd::logger::warn<std::__cxx11::string,long,unsigned_long>
              (peVar2,"Could not write the full buffer to {}: written = {}; size = {}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffc0,&local_70,&local_68);
  }
  io::utils::close(local_44);
  MemoryBuffer::wipe(this_00);
  iVar1 = make_file_record((FileStorage *)filename.field_2._8_8_,
                           (string *)filename.field_2._M_allocated_capacity,
                           filename._M_string_length);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::shared_ptr<diy::spd::logger>::~shared_ptr((shared_ptr<diy::spd::logger> *)0x11e753);
  return iVar1;
}

Assistant:

virtual int   put(MemoryBuffer& bb) override
      {
        auto log = get_logger();
        std::string     filename;
        int fh = open_random(filename);

        log->debug("FileStorage::put(): {}; buffer size: {}", filename, bb.size());

        size_t sz = bb.buffer.size();
#if defined(_WIN32)
        using r_type = int;
        r_type written = _write(fh, &bb.buffer[0], static_cast<unsigned int>(sz));
#else
        using r_type = ssize_t;
        r_type written = write(fh, &bb.buffer[0], sz);
#endif
        if (written < static_cast<r_type>(sz) || written == r_type(-1))
          log->warn("Could not write the full buffer to {}: written = {}; size = {}", filename, written, sz);
        io::utils::close(fh);
        bb.wipe();

#if 0       // double-check the written file size: only for extreme debugging
        FILE* fp = fopen(filename.c_str(), "r");
        fseek(fp, 0L, SEEK_END);
        int fsz = ftell(fp);
        if (fsz != sz)
            log->warn("file size doesn't match the buffer size, {} vs {}", fsz, sz);
        fclose(fp);
#endif

        return make_file_record(filename, sz);
      }